

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylnsymmat.h
# Opt level: O2

void __thiscall
TPZSkylNSymMatrix<double>::CopyFrom(TPZSkylNSymMatrix<double> *this,TPZMatrix<double> *mat)

{
  TPZSkylNSymMatrix<double> *A;
  
  if (mat != (TPZMatrix<double> *)0x0) {
    A = (TPZSkylNSymMatrix<double> *)__dynamic_cast(mat,&TPZMatrix<double>::typeinfo,&typeinfo,0);
    if (A != (TPZSkylNSymMatrix<double> *)0x0) {
      operator=(this,A);
      return;
    }
  }
  std::operator<<((ostream *)&std::cerr,
                  "virtual void TPZSkylNSymMatrix<>::CopyFrom(const TPZMatrix<TVar> *) [TVar = double]"
                 );
  std::operator<<((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.");
  std::operator<<((ostream *)&std::cerr,"Aborting...\n");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzskylnsymmat.h"
             ,0x49);
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override
  {                                                           
    auto *from = dynamic_cast<const TPZSkylNSymMatrix<TVar> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }